

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

UBool __thiscall icu_63::TimeZone::operator==(TimeZone *this,TimeZone *that)

{
  bool bVar1;
  UBool UVar2;
  bool local_21;
  TimeZone *that_local;
  TimeZone *this_local;
  
  if (this == (TimeZone *)0x0) {
    __cxa_bad_typeid();
  }
  bVar1 = std::type_info::operator==
                    ((type_info *)(this->super_UObject)._vptr_UObject[-1],
                     (type_info *)(that->super_UObject)._vptr_UObject[-1]);
  local_21 = false;
  if (bVar1) {
    UVar2 = UnicodeString::operator==(&this->fID,&that->fID);
    local_21 = UVar2 != '\0';
  }
  return local_21;
}

Assistant:

UBool
TimeZone::operator==(const TimeZone& that) const
{
    return typeid(*this) == typeid(that) &&
        fID == that.fID;
}